

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::ICRS2Observed
              (double ra,double dec,double *az,double *zen,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type,double wavelength,double *observed_ra,double *observed_dec,
              double *hour_angle)

{
  int iVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  double *in_RSI;
  double *in_RDI;
  int *in_R8;
  double *in_R9;
  double *in_XMM0_Qa;
  double in_XMM1_Qa;
  double *in_XMM2_Qa;
  double *unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  int err_code;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  double local_60;
  double local_58;
  double *hour_angle_00;
  
  hour_angle_00 = (double *)0x0;
  local_58 = 0.0;
  local_60 = 0.0;
  if (in_R9 == (double *)0x0) {
    in_R9 = (double *)&stack0xffffffffffffffb0;
  }
  if (in_stack_00000008 == (double *)0x0) {
    in_stack_00000008 = &local_58;
  }
  if (in_stack_00000010 == (double *)0x0) {
    in_stack_00000010 = &local_60;
  }
  if (*in_R8 == 0) {
    in_XMM0_Qa = (double *)((double)in_XMM0_Qa * 0.017453292519943295);
    in_XMM1_Qa = in_XMM1_Qa * 0.017453292519943295;
  }
  (**(code **)(*in_RDX + 0x20))();
  CEObserver::Longitude_Rad(in_RCX);
  CEObserver::Latitude_Rad(in_RCX);
  CEObserver::Elevation_m(in_RCX);
  CEObserver::Pressure_hPa(in_RCX);
  CEObserver::Temperature_C(in_RCX);
  CEObserver::RelativeHumidity(in_RCX);
  CEDate::dut1((CEDate *)0x14b256);
  CEDate::xpolar((CEDate *)0x14b269);
  CEDate::ypolar((CEDate *)0x14b27f);
  iVar1 = ICRS2Observed((double)in_stack_00000010,(double)in_stack_00000008,unaff_retaddr,in_XMM0_Qa
                        ,in_XMM1_Qa,(double)in_RDI,(double)in_RSI,(double)in_RDX,(double)in_RCX,
                        (double)in_R8,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                        in_stack_00000038,in_stack_00000040,in_XMM2_Qa,in_R9,hour_angle_00);
  if (*in_R8 == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    *in_RSI = *in_RSI * 57.29577951308232;
    *in_R9 = *in_R9 * 57.29577951308232;
    *in_stack_00000008 = *in_stack_00000008 * 57.29577951308232;
    *in_stack_00000010 = *in_stack_00000010 * 57.29577951308232;
  }
  return iVar1;
}

Assistant:

int CECoordinates::ICRS2Observed(double ra, double dec,
                                 double *az, double *zen,
                                 const CEDate&     date,
                                 const CEObserver& observer,
                                 const CEAngleType& angle_type,
                                 double wavelength,
                                 double *observed_ra,
                                 double *observed_dec,
                                 double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were not passed, point them at the temporary ones
    if (observed_ra  == nullptr) observed_ra  = &temp_ra;
    if (observed_dec == nullptr) observed_dec = &temp_dec;
    if (hour_angle   == nullptr) hour_angle   = &temp_hour_angle;

    // If we've passed in angles that are in degrees we need to convert to radians
    if (angle_type == CEAngleType::DEGREES) {
        ra  *= DD2R ;
        dec *= DD2R ;
    }

    // Call the necessary sofa method
    int err_code = ICRS2Observed(ra, dec,
                                 az, zen,
                                 date.JD(),
                                 observer.Longitude_Rad(),
                                 observer.Latitude_Rad(),
                                 observer.Elevation_m(),
                                 observer.Pressure_hPa(),
                                 observer.Temperature_C(),
                                 observer.RelativeHumidity(),
                                 date.dut1(),
                                 date.xpolar(),
                                 date.ypolar(),
                                 wavelength,
                                 observed_ra, observed_dec, hour_angle) ;

    // Now convert back to degrees if that's what we were passed
    if (angle_type == CEAngleType::DEGREES) {
        *az           *= DR2D ;
        *zen          *= DR2D ;
        *observed_ra  *= DR2D ;
        *observed_dec *= DR2D ;
        *hour_angle   *= DR2D ;
    }
    
    return err_code ;
}